

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player_mike_3.h
# Opt level: O1

void __thiscall
PlayerMike_3::fillPredict(PlayerMike_3 *this,vector<Move,_std::allocator<Move>_> *moveHistory)

{
  int *piVar1;
  pointer piVar2;
  pointer pMVar3;
  ulong uVar4;
  long lVar5;
  
  piVar2 = (this->m_predict).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar2[0x17] = 0;
  piVar2[0x18] = 0;
  piVar2[0x19] = 0;
  piVar2[0x1a] = 0;
  piVar2[0x14] = 0;
  piVar2[0x15] = 0;
  piVar2[0x16] = 0;
  piVar2[0x17] = 0;
  piVar2[0x10] = 0;
  piVar2[0x11] = 0;
  piVar2[0x12] = 0;
  piVar2[0x13] = 0;
  piVar2[0xc] = 0;
  piVar2[0xd] = 0;
  piVar2[0xe] = 0;
  piVar2[0xf] = 0;
  piVar2[8] = 0;
  piVar2[9] = 0;
  piVar2[10] = 0;
  piVar2[0xb] = 0;
  piVar2[4] = 0;
  piVar2[5] = 0;
  piVar2[6] = 0;
  piVar2[7] = 0;
  piVar2[0] = 0;
  piVar2[1] = 0;
  piVar2[2] = 0;
  piVar2[3] = 0;
  pMVar3 = (moveHistory->super__Vector_base<Move,_std::allocator<Move>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = (long)(moveHistory->super__Vector_base<Move,_std::allocator<Move>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pMVar3 >> 3;
  if (1 < uVar4) {
    piVar2 = (this->m_predict).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar5 = 0;
    do {
      piVar1 = piVar2 + (long)pMVar3[lVar5 + 1].m_you +
                        (long)pMVar3[lVar5].m_me * 3 + (long)pMVar3[lVar5].m_you * 9;
      *piVar1 = *piVar1 + 1;
      lVar5 = lVar5 + 1;
    } while (uVar4 - 1 != lVar5);
  }
  return;
}

Assistant:

void fillPredict(const std::vector<Move>& moveHistory)
   {
      for (int ix=0; ix<27; ++ix)
      {
         m_predict[ix] = 0;
      }

      for (size_t i=1; i<moveHistory.size(); ++i)
      {
         int ix = moveHistory[i-1].m_you*9 + moveHistory[i-1].m_me*3 + moveHistory[i].m_you;
         m_predict[ix] += 1;
      }

#ifdef DEBUG
      for (int row=0; row<9; ++row)
      {
         std::cout << m_predict[3*row] << " , " << m_predict[3*row+1] << " , " << m_predict[3*row+2] << std::endl;
      }
#endif
   }